

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,big_decimal_fp *fp,
          basic_format_specs<char16_t> *specs,float_specs fspecs,locale_ref loc)

{
  uint uVar1;
  char cVar2;
  long lVar3;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar4;
  undefined1 decimal_point_00 [2];
  int iVar5;
  uint uVar6;
  basic_format_specs<char16_t> *significand_00;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  char16_t decimal_point;
  bool pointy;
  char16_t zero;
  int significand_size;
  sign_t sign;
  char *significand;
  int exp;
  digit_grouping<char16_t> grouping;
  anon_class_40_8_70a3e612 write;
  undefined1 local_ea [2];
  bool local_e8 [6];
  undefined1 local_e2 [6];
  sign_t local_dc;
  basic_format_specs<char16_t> *local_d8;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  short local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  bool *local_48;
  bool *local_40;
  char16_t *local_38;
  
  local_c8._0_8_ = fp->significand;
  uVar11 = fp->significand_size;
  local_e2._0_2_ = L'0';
  uVar7 = (ulong)fspecs >> 0x28 & 0xff;
  local_dc = (sign_t)uVar7;
  local_e2._2_4_ = uVar11;
  local_80 = (undefined1  [8])fspecs;
  if ((int)uVar11 < 0) {
LAB_00163ffd:
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  }
  uVar8 = (ulong)((uVar11 + 1) - (uint)(local_dc == none));
  local_ea = (undefined1  [2])0x2e;
  uVar6 = fspecs._4_4_;
  significand_00 = (basic_format_specs<char16_t> *)local_c8._0_8_;
  if ((uVar6 >> 0x11 & 1) != 0) {
    local_d8 = (basic_format_specs<char16_t> *)local_c8._0_8_;
    local_d0.container = (buffer<char16_t> *)fp;
    local_90 = uVar7;
    local_88 = (ulong)uVar11;
    cVar2 = fmt::v8::detail::decimal_point_impl<char>(loc);
    uVar11 = (uint)local_88;
    local_ea = (undefined1  [2])(short)cVar2;
    significand_00 = local_d8;
    fp = (big_decimal_fp *)local_d0;
    uVar7 = local_90;
  }
  uVar1 = *(int *)((long)&((buffer<char16_t> *)fp)->ptr_ + 4);
  local_c8._12_4_ = uVar11 + uVar1;
  iVar5 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00163c68:
    iVar12 = uVar11 + uVar1 + -1;
    if ((uVar6 >> 0x14 & 1) == 0) {
      uVar15 = 0;
      if (uVar11 == 1) {
        local_ea = (undefined1  [2])0x0;
        uVar15 = 0;
      }
    }
    else {
      uVar15 = 0;
      if (0 < (int)(iVar5 - uVar11)) {
        uVar15 = (ulong)(iVar5 - uVar11);
      }
      uVar8 = uVar8 + uVar15;
    }
    bVar13 = ((uVar6 >> 0x10 & 1) == 0) << 5;
    local_78._0_4_ = (sign_t)uVar7;
    local_78._20_2_ = local_ea;
    local_78._16_4_ = uVar11;
    iVar5 = (int)uVar15;
    local_60._0_6_ = CONCAT24(L'0',iVar5);
    local_60 = (buffer<char16_t> *)
               (CONCAT17(local_60._7_1_,CONCAT16(bVar13,(undefined6)local_60)) | 0x45000000000000);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_58._4_4_,iVar12);
    local_78._8_8_ = significand_00;
    if (0 < specs->width) {
      if ((int)local_c8._12_4_ < 1) {
        iVar12 = 1 - local_c8._12_4_;
      }
      lVar14 = 2;
      if (99 < iVar12) {
        lVar14 = (ulong)(999 < iVar12) + 3;
      }
      sVar16 = uVar8 + (3 - (ulong)(local_ea == (undefined1  [2])0x0)) + lVar14;
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        (out,specs,sVar16,sVar16,(anon_class_40_8_70a3e612 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar4.container;
    }
    decimal_point_00 = local_ea;
    if ((sign_t)uVar7 != none) {
      cVar2 = ""[uVar7];
      sVar16 = (out.container)->size_;
      uVar7 = sVar16 + 1;
      if ((out.container)->capacity_ < uVar7) {
        (**(out.container)->_vptr_buffer)(out.container);
        sVar16 = (out.container)->size_;
        uVar7 = sVar16 + 1;
      }
      (out.container)->size_ = uVar7;
      (out.container)->ptr_[sVar16] = (short)cVar2;
      decimal_point_00 = (undefined1  [2])local_78._20_2_;
    }
    bVar4 = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
                      (out,(char *)significand_00,uVar11,1,(char16_t)decimal_point_00);
    bVar13 = bVar13 | 0x45;
    if (iVar5 != 0) {
      bVar4 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,char16_t>
                        (bVar4,iVar5,(char16_t *)((long)&local_60 + 4));
      bVar13 = local_60._6_1_;
    }
    sVar16 = (bVar4.container)->size_;
    uVar7 = sVar16 + 1;
    if ((bVar4.container)->capacity_ < uVar7) {
      (**(bVar4.container)->_vptr_buffer)(bVar4.container);
      sVar16 = (bVar4.container)->size_;
      uVar7 = sVar16 + 1;
    }
    (bVar4.container)->size_ = uVar7;
    (bVar4.container)->ptr_[sVar16] = (short)(char)bVar13;
    bVar4 = write_exponent<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      ((int)local_58,bVar4);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar4.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar12 = 0x10;
    if (0 < iVar5) {
      iVar12 = iVar5;
    }
    if (((int)local_c8._12_4_ < -3) || (iVar12 < (int)local_c8._12_4_)) goto LAB_00163c68;
  }
  if ((int)uVar1 < 0) {
    if ((int)local_c8._12_4_ < 1) {
      iVar12 = -local_c8._12_4_;
      local_b8._M_allocated_capacity._0_4_ = iVar12;
      if (SBORROW4(iVar5,iVar12) != iVar5 + local_c8._12_4_ < 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar5;
      }
      if (iVar5 < 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar12;
      }
      if (uVar11 != 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar12;
      }
      if (uVar11 == 0 && local_b8._M_allocated_capacity._0_4_ == 0) {
        local_e8[0] = (bool)(char)((uVar6 & 0x100000) >> 0x14);
        iVar5 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_e8[0] = true;
        iVar5 = 2;
        if ((int)local_b8._M_allocated_capacity._0_4_ < 0) goto LAB_00163ffd;
      }
      sVar16 = (uint)(iVar5 + local_b8._M_allocated_capacity._0_4_) + uVar8;
      local_78._0_8_ = &local_dc;
      local_78._8_8_ = local_e2;
      local_78._16_8_ = local_e8;
      local_60 = (buffer<char16_t> *)local_ea;
      local_58 = &local_b8;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_c8;
      local_48 = (bool *)(local_e2 + 2);
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_&>
                        (out,specs,sVar16,sVar16,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar4.container;
    }
    iVar12 = 0;
    local_e8._0_4_ = iVar5 - uVar11 & (int)(uVar6 << 0xb) >> 0x1f;
    uVar11 = local_e8._0_4_;
    if ((int)local_e8._0_4_ < 1) {
      uVar11 = 0;
    }
    local_d8 = specs;
    local_d0.container = out.container;
    digit_grouping<char16_t>::digit_grouping
              ((digit_grouping<char16_t> *)&local_b8,loc,(bool)((byte)(uVar6 >> 0x11) & 1));
    if (local_98 != 0) {
      pcVar9 = (char *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                local_b8._M_allocated_capacity._0_4_);
      pcVar10 = pcVar9 + local_b8._8_8_;
      lVar14 = 0;
      do {
        if (pcVar9 == pcVar10) {
          cVar2 = pcVar10[-1];
          pcVar9 = pcVar10;
        }
        else {
          cVar2 = *pcVar9;
          if ((byte)(cVar2 + 0x81U) < 0x82) goto LAB_00164021;
          pcVar9 = pcVar9 + 1;
        }
        iVar12 = iVar12 + cVar2;
        if ((int)local_e2._2_4_ <= iVar12) goto LAB_00164021;
        lVar14 = lVar14 + 1;
      } while( true );
    }
    lVar14 = 0;
LAB_00164021:
    sVar16 = uVar8 + uVar11 + 1 + lVar14;
    local_78._0_8_ = &local_dc;
    local_78._8_8_ = local_c8;
    local_78._16_8_ = local_e2 + 2;
    local_60 = (buffer<char16_t> *)(local_c8 + 0xc);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_ea;
    local_48 = local_e8;
    local_40 = (bool *)local_e2;
    local_50 = &local_b8;
    bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_&>
                      (local_d0,local_d8,sVar16,sVar16,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_00164079;
  }
  lVar14 = uVar1 + uVar8;
  local_e8._0_4_ = iVar5 - local_c8._12_4_;
  if ((uVar6 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e8._0_4_) {
      if ((int)local_e8._0_4_ < 1) goto LAB_00163ef5;
    }
    else {
      local_e8[0] = true;
      local_e8[1] = false;
      local_e8[2] = false;
      local_e8[3] = false;
    }
    lVar14 = lVar14 + (ulong)(uint)local_e8._0_4_ + 1;
  }
LAB_00163ef5:
  digit_grouping<char16_t>::digit_grouping
            ((digit_grouping<char16_t> *)&local_b8,loc,(bool)((byte)(uVar6 >> 0x11) & 1));
  iVar5 = 0;
  if (local_98 != 0) {
    pcVar9 = (char *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                              local_b8._M_allocated_capacity._0_4_);
    pcVar10 = pcVar9 + local_b8._8_8_;
    lVar3 = 0;
    do {
      if (pcVar9 == pcVar10) {
        cVar2 = pcVar10[-1];
        pcVar9 = pcVar10;
      }
      else {
        cVar2 = *pcVar9;
        if ((byte)(cVar2 + 0x81U) < 0x82) goto LAB_00163f66;
        pcVar9 = pcVar9 + 1;
      }
      iVar5 = iVar5 + cVar2;
      if ((int)local_e2._2_4_ <= iVar5) goto LAB_00163f66;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  lVar3 = 0;
LAB_00163f66:
  local_78._0_8_ = &local_dc;
  local_78._8_8_ = local_c8;
  local_78._16_8_ = local_e2 + 2;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_80;
  local_48 = (bool *)local_ea;
  local_40 = local_e8;
  local_38 = (char16_t *)local_e2;
  local_60 = (buffer<char16_t> *)fp;
  local_58 = &local_b8;
  bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_&>
                    (out,specs,lVar14 + lVar3,lVar14 + lVar3,(anon_class_72_9_d68ba176 *)local_78);
LAB_00164079:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8._M_allocated_capacity._4_4_,local_b8._M_allocated_capacity._0_4_) !=
      &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                local_b8._M_allocated_capacity._0_4_),
                    local_a8._M_allocated_capacity + 1);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}